

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::CopyFrom
          (TPZSkylMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  TPZSkylMatrix<std::complex<float>_> *A;
  
  if (mat != (TPZMatrix<std::complex<float>_> *)0x0) {
    A = (TPZSkylMatrix<std::complex<float>_> *)
        __dynamic_cast(mat,&TPZMatrix<std::complex<float>>::typeinfo,
                       &TPZSkylMatrix<std::complex<float>>::typeinfo,0);
    if (A != (TPZSkylMatrix<std::complex<float>_> *)0x0) {
      operator=(this,A);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZSkylMatrix<std::complex<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<float>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.h",
             0x74);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }